

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O3

Error * ot::commissioner::security_material::GetNetworkSM
                  (Error *__return_storage_ptr__,string *aAlias,bool aNeedCert,bool aNeedPSKc,
                  SecurityMaterials *aSM)

{
  char cVar1;
  ErrorCode EVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Alloc_hider _Var5;
  char *pcVar6;
  undefined7 in_register_00000009;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __rhs;
  long lVar7;
  char *pcVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string out;
  string path;
  Error tokenError;
  writer write;
  string nwkPath;
  writer write_1;
  ByteArray bytes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  undefined1 local_1f8 [24];
  char local_1e0 [16];
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  _Alloc_hider _Stack_1a0;
  undefined1 local_198 [24];
  parse_func local_180 [1];
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_168;
  ByteArray *local_160;
  undefined4 *local_158 [2];
  undefined4 local_148;
  undefined2 local_144;
  undefined1 local_142;
  ByteArray *local_138;
  SecurityMaterials *local_130;
  undefined4 local_124;
  undefined1 local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  writer local_e0;
  ByteArray local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  pointer local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  local_68;
  string local_50;
  
  local_124 = (undefined4)CONCAT71(in_register_00000009,aNeedPSKc);
  local_a8[0] = local_98;
  local_130 = aSM;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"nwk/","");
  __return_storage_ptr__->mCode = kNone;
  local_1d0 = (string *)&__return_storage_ptr__->mMessage;
  local_b8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_b8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char*>((string *)local_1a8,smRoot,DAT_003a4080 + smRoot);
  _Var5._M_p = _Stack_1a0._M_p;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8);
  }
  if (_Var5._M_p != (pointer)0x0) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,smRoot,DAT_003a4080 + smRoot);
    pcVar6 = (char *)std::__cxx11::string::_M_append(local_1a8,(ulong)local_a8[0]);
    pcVar6 = (char *)std::__cxx11::string::_M_append(pcVar6,(ulong)(aAlias->_M_dataplus)._M_p);
    std::__cxx11::string::append(pcVar6);
    std::__cxx11::string::_M_assign((string *)&local_100);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    PathExists((Error *)local_1a8,&local_50);
    __return_storage_ptr__->mCode = local_1a8._0_4_;
    std::__cxx11::string::operator=(local_1d0,(string *)&_Stack_1a0);
    EVar2 = __return_storage_ptr__->mCode;
    if (_Stack_1a0._M_p != local_198 + 8) {
      operator_delete(_Stack_1a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (EVar2 == kNone) {
      if (aNeedCert) {
        local_180[0] = (parse_func)&local_170;
        local_198._0_8_ = 0x6d65702e74726563;
        _Stack_1a0._M_p = (pointer)0x8;
        local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
        local_198._16_8_ = &local_130->mCertificate;
        local_170 = 0x6d65702e76697270;
        local_178 = 8;
        local_168 = 0;
        local_160 = &local_130->mPrivateKey;
        local_148 = 0x702e6163;
        local_144 = 0x6d65;
        local_158[1] = (undefined4 *)0x6;
        local_142 = 0;
        local_138 = &local_130->mTrustAnchor;
        __l._M_len = 3;
        __l._M_array = (iterator)local_1a8;
        local_1a8 = (undefined1  [8])local_198;
        local_158[0] = &local_148;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::vector(&local_68,__l,(allocator_type *)local_1f8);
        lVar7 = 0;
        do {
          if ((void *)((long)&local_148 + lVar7) != *(void **)((long)local_158 + lVar7)) {
            operator_delete(*(void **)((long)local_158 + lVar7));
          }
          lVar7 = lVar7 + -0x28;
        } while (lVar7 != -0x78);
        local_b0 = local_68.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __rhs = local_68.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::operator+(&local_1c8,&local_100,&__rhs->first);
            local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
            _Stack_1a0._M_p = local_198 + 8;
            local_198._0_8_ = 0;
            local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,local_1c8._M_dataplus._M_p,
                       local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
            PathExists((Error *)local_1f8,&local_88);
            uVar4 = local_1a8._0_4_;
            uVar3 = local_1f8._0_4_;
            if ((char *)local_1f8._8_8_ != local_1e0) {
              operator_delete((void *)local_1f8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if (_Stack_1a0._M_p != local_198 + 8) {
              operator_delete(_Stack_1a0._M_p);
            }
            if (uVar4 == uVar3) {
              local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ReadPemFile((Error *)local_1a8,&local_d8,&local_1c8);
              __return_storage_ptr__->mCode = local_1a8._0_4_;
              std::__cxx11::string::operator=(local_1d0,(string *)&_Stack_1a0);
              if (_Stack_1a0._M_p != local_198 + 8) {
                operator_delete(_Stack_1a0._M_p);
              }
              if (__return_storage_ptr__->mCode == kNone) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (__rhs->second,&local_d8);
              }
              else {
                if (gVerbose == '\x01') {
                  local_1a8._0_4_ = kAlreadyExists;
                  _Stack_1a0._M_p = "Failed to read security data from file {}";
                  local_198._0_8_ = 0x29;
                  local_198._8_8_ = 0x100000000;
                  local_198._16_8_ = local_1a8;
                  local_180[0] = ::fmt::v10::detail::
                                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  pcVar6 = "Failed to read security data from file {}";
                  local_120._0_8_ = local_198._16_8_;
                  do {
                    cVar1 = *pcVar6;
                    pcVar8 = pcVar6;
                    while (cVar1 != '{') {
                      pcVar8 = pcVar8 + 1;
                      if (pcVar8 == "") {
                        ::fmt::v10::detail::
                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::writer::operator()((writer *)local_120,pcVar6,"");
                        goto LAB_0028796a;
                      }
                      cVar1 = *pcVar8;
                    }
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)local_120,pcVar6,pcVar8);
                    pcVar6 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar8,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_1a8);
                  } while (pcVar6 != "");
LAB_0028796a:
                  local_1a8 = (undefined1  [8])local_1c8._M_dataplus._M_p;
                  _Stack_1a0._M_p = (pointer)local_1c8._M_string_length;
                  args.field_1.args_ = in_R9.args_;
                  args.desc_ = (unsigned_long_long)local_1a8;
                  fmt.size_ = 0xd;
                  fmt.data_ = (char *)0x29;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_1f8,(v10 *)"Failed to read security data from file {}",
                             fmt,args);
                  Console::Write((string *)local_1f8,kRed);
                }
                else {
                  local_1f8._0_8_ = local_1f8 + 0x10;
                  local_1a8 = (undefined1  [8])0x12;
                  local_1f8._0_8_ =
                       std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_1a8);
                  local_1f8._16_8_ = local_1a8;
                  builtin_memcpy((void *)local_1f8._0_8_,"security-materials",0x12);
                  local_1f8._8_8_ = local_1a8;
                  *(uchar *)(local_1f8._0_8_ + (long)local_1a8) = '\0';
                  local_1a8._0_4_ = kAlreadyExists;
                  pcVar6 = "Failed to read security data from file {}";
                  _Stack_1a0._M_p = "Failed to read security data from file {}";
                  local_198._0_8_ = 0x29;
                  local_198._8_8_ = 0x100000000;
                  local_180[0] = ::fmt::v10::detail::
                                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  local_198._16_8_ =
                       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8;
                  local_e0.handler_ =
                       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8;
                  do {
                    cVar1 = *pcVar6;
                    pcVar8 = pcVar6;
                    while (cVar1 != '{') {
                      pcVar8 = pcVar8 + 1;
                      if (pcVar8 == "") {
                        ::fmt::v10::detail::
                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::writer::operator()(&local_e0,pcVar6,"");
                        goto LAB_002879b4;
                      }
                      cVar1 = *pcVar8;
                    }
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&local_e0,pcVar6,pcVar8);
                    pcVar6 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar8,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_1a8);
                  } while (pcVar6 != "");
LAB_002879b4:
                  local_1a8 = (undefined1  [8])local_1c8._M_dataplus._M_p;
                  _Stack_1a0._M_p = (pointer)local_1c8._M_string_length;
                  args_00.field_1.args_ = in_R9.args_;
                  args_00.desc_ = (unsigned_long_long)local_1a8;
                  fmt_00.size_ = 0xd;
                  fmt_00.data_ = (char *)0x29;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_120,(v10 *)"Failed to read security data from file {}",
                             fmt_00,args_00);
                  Log(kError,(string *)local_1f8,(string *)local_120);
                  if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_120._0_8_ !=
                      (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_120 + 0x10)) {
                    operator_delete((void *)local_120._0_8_);
                  }
                }
                if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                  operator_delete((void *)local_1f8._0_8_);
                }
              }
              if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
            __rhs = __rhs + 1;
          } while (__rhs != local_b0);
        }
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_100._M_dataplus._M_p,
                   local_100._M_dataplus._M_p + local_100._M_string_length);
        std::__cxx11::string::append((char *)&local_1c8);
        local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
        _Stack_1a0._M_p = local_198 + 8;
        local_198._0_8_ = 0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
        local_120._0_8_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_120 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_120,local_1c8._M_dataplus._M_p,
                   local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
        PathExists((Error *)local_1f8,(string *)local_120);
        uVar4 = local_1a8._0_4_;
        uVar3 = local_1f8._0_4_;
        if ((char *)local_1f8._8_8_ != local_1e0) {
          operator_delete((void *)local_1f8._8_8_);
        }
        if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_120._0_8_ !=
            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_);
        }
        if (_Stack_1a0._M_p != local_198 + 8) {
          operator_delete(_Stack_1a0._M_p);
        }
        if (uVar4 == uVar3) {
          local_1f8._0_8_ = (pointer)0x0;
          local_1f8._8_8_ = (char *)0x0;
          local_1f8._16_8_ = (pointer)0x0;
          ReadHexStringFile((Error *)local_1a8,(ByteArray *)local_1f8,&local_1c8);
          if (local_1a8._0_4_ == none_type) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&local_130->mCommissionerToken,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8);
          }
          if (_Stack_1a0._M_p != local_198 + 8) {
            operator_delete(_Stack_1a0._M_p);
          }
          if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1f8._0_8_);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::~vector(&local_68);
      }
      if ((char)local_124 != '\0') {
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,local_100._M_dataplus._M_p,
                   local_100._M_dataplus._M_p + local_100._M_string_length);
        std::__cxx11::string::append(local_1f8);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_1f8._0_8_,(char *)(local_1f8._8_8_ + local_1f8._0_8_))
        ;
        PathExists((Error *)local_1a8,&local_1c8);
        __return_storage_ptr__->mCode = local_1a8._0_4_;
        std::__cxx11::string::operator=(local_1d0,(string *)&_Stack_1a0);
        EVar2 = __return_storage_ptr__->mCode;
        if (_Stack_1a0._M_p != local_198 + 8) {
          operator_delete(_Stack_1a0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (EVar2 == kNone) {
          ReadHexStringFile((Error *)local_1a8,&local_130->mPSKc,(string *)local_1f8);
          __return_storage_ptr__->mCode = local_1a8._0_4_;
          std::__cxx11::string::operator=(local_1d0,(string *)&_Stack_1a0);
          if (_Stack_1a0._M_p != local_198 + 8) {
            operator_delete(_Stack_1a0._M_p);
          }
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetNetworkSM(const std::string &aAlias, bool aNeedCert, bool aNeedPSKc, SecurityMaterials &aSM)
{
    return GetNetworkSMImpl("nwk/", aAlias, aNeedCert, aNeedPSKc, aSM);
}